

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_draw_grid(int slices,float spacing)

{
  rf_render_batch *prVar1;
  long lVar2;
  rf_vertex_buffer *prVar3;
  int iVar4;
  uchar z;
  ulong uVar5;
  uchar y;
  uchar x;
  int iVar6;
  int iVar7;
  float x_00;
  
  prVar1 = (rf__ctx->field_0).current_batch;
  lVar2 = prVar1->current_buffer;
  prVar3 = prVar1->vertex_buffers;
  if (prVar3[lVar2].elements_count * 4 <= slices * 4 + prVar3[lVar2].v_counter) {
    rf_gfx_draw();
  }
  rf_gfx_begin(RF_LINES);
  if (-2 < slices) {
    iVar6 = slices / 2;
    iVar4 = -iVar6;
    uVar5 = (ulong)iVar4;
    iVar7 = iVar6;
    if (iVar6 == iVar4 || SBORROW4(iVar6,iVar4) != iVar6 * 2 < 0) {
      iVar7 = iVar4;
    }
    do {
      if (uVar5 == 0) {
        rf_gfx_color4ub('\x7f','\x7f','\x7f',0xff);
        rf_gfx_color4ub('\x7f','\x7f','\x7f',0xff);
        rf_gfx_color4ub('\x7f','\x7f','\x7f',0xff);
        x = '\x7f';
        y = '\x7f';
        z = '\x7f';
      }
      else {
        rf_gfx_color4ub(0xbf,0xbf,0xbf,0xff);
        rf_gfx_color4ub(0xbf,0xbf,0xbf,0xff);
        rf_gfx_color4ub(0xbf,0xbf,0xbf,0xff);
        x = 0xbf;
        y = 0xbf;
        z = 0xbf;
      }
      rf_gfx_color4ub(x,y,z,0xff);
      x_00 = (float)(long)uVar5 * spacing;
      rf_gfx_vertex3f(x_00,0.0,(float)iVar4 * spacing);
      rf_gfx_vertex3f(x_00,0.0,(float)iVar6 * spacing);
      rf_gfx_vertex3f((float)iVar4 * spacing,0.0,x_00);
      rf_gfx_vertex3f((float)iVar6 * spacing,0.0,x_00);
      uVar5 = uVar5 + 1;
    } while (iVar7 + 1 != uVar5);
  }
  rf_gfx_end();
  return;
}

Assistant:

RF_API void rf_draw_grid(int slices, float spacing)
{
    int half_slices = slices/2;

    if (rf_gfx_check_buffer_limit(slices * 4)) rf_gfx_draw();

    rf_gfx_begin(RF_LINES);
    for (rf_int i = -half_slices; i <= half_slices; i++)
    {
        if (i == 0)
        {
            rf_gfx_color3f(0.5f, 0.5f, 0.5f);
            rf_gfx_color3f(0.5f, 0.5f, 0.5f);
            rf_gfx_color3f(0.5f, 0.5f, 0.5f);
            rf_gfx_color3f(0.5f, 0.5f, 0.5f);
        }
        else
        {
            rf_gfx_color3f(0.75f, 0.75f, 0.75f);
            rf_gfx_color3f(0.75f, 0.75f, 0.75f);
            rf_gfx_color3f(0.75f, 0.75f, 0.75f);
            rf_gfx_color3f(0.75f, 0.75f, 0.75f);
        }

        rf_gfx_vertex3f((float)i*spacing, 0.0f, (float)-half_slices*spacing);
        rf_gfx_vertex3f((float)i*spacing, 0.0f, (float)half_slices*spacing);

        rf_gfx_vertex3f((float)-half_slices*spacing, 0.0f, (float)i*spacing);
        rf_gfx_vertex3f((float)half_slices*spacing, 0.0f, (float)i*spacing);
    }
    rf_gfx_end();
}